

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_tools.cpp
# Opt level: O0

ON_Mesh * ON_ControlPolygonMesh(ON_NurbsSurface *nurbs_surface,bool bCleanMesh,ON_Mesh *input_mesh)

{
  double s;
  float fVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  double *pdVar9;
  ON_SimpleArray<ON_3dPoint> *this;
  ON_3dPoint *pOVar10;
  ON_3fVector *pOVar11;
  ON_2dPoint *pOVar12;
  ON_2fPoint *this_00;
  ON_3fVector *pOVar13;
  uint *puVar14;
  ON_MeshFace *pOVar15;
  ON_MeshFace *pOVar16;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined8 in_XMM1_Qa;
  double dVar17;
  ON_Mesh *local_370;
  byte local_2ad;
  byte local_2aa;
  ON_3dPoint local_268;
  ON_3dPoint local_250;
  ON_3dPoint local_238;
  ON_3dPoint local_220;
  ON_MeshFace *local_208;
  ON_MeshFace *f_1;
  ON_SimpleArray<int> badfi;
  ON_3dPoint P [4];
  ON_3dPoint local_180;
  ON_3dPoint local_168;
  ON_3dPoint local_150;
  ON_MeshFace *local_138;
  ON_MeshFace *f;
  uint local_128;
  int k;
  int j;
  int i;
  int hint [2];
  ON_2dPoint T;
  ON_2dPoint S;
  ON_3dVector N;
  ON_3dPoint V;
  ON_3dPointArray *dpv;
  int face_count;
  int vertex_count;
  ON_Mesh *local_a8;
  ON_Mesh *mesh;
  undefined1 auStack_98 [4];
  bool bIsClosed1;
  bool bPeriodic1;
  bool bIsClosed0;
  bool bPeriodic0;
  ON_Interval d1;
  ON_Interval d0;
  undefined1 local_68 [8];
  ON_SimpleArray<double> gv;
  ON_SimpleArray<double> gu;
  int v1;
  int v0;
  int u1;
  int u0;
  ON_Mesh *input_mesh_local;
  bool bCleanMesh_local;
  ON_NurbsSurface *nurbs_surface_local;
  
  v0 = 0;
  v1 = ON_NurbsSurface::CVCount(nurbs_surface,0);
  gu.m_capacity = 0;
  gu.m_count = ON_NurbsSurface::CVCount(nurbs_surface,1);
  if ((nurbs_surface->m_cv == (double *)0x0) ||
     (uVar5 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                [6])(nurbs_surface,0), (uVar5 & 1) == 0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh_tools.cpp"
               ,0x355,"","ON_ControlPolygonMesh - surface is not valid");
    nurbs_surface_local = (ON_NurbsSurface *)0x0;
  }
  else {
    ON_SimpleArray<double>::ON_SimpleArray((ON_SimpleArray<double> *)&gv.m_count,(long)v1);
    ON_SimpleArray<double>::ON_SimpleArray((ON_SimpleArray<double> *)local_68,(long)gu.m_count);
    ON_SimpleArray<double>::SetCount((ON_SimpleArray<double> *)&gv.m_count,v1);
    ON_SimpleArray<double>::SetCount((ON_SimpleArray<double> *)local_68,gu.m_count);
    pdVar9 = ON_SimpleArray<double>::Array((ON_SimpleArray<double> *)&gv.m_count);
    ON_NurbsSurface::GetGrevilleAbcissae(nurbs_surface,0,pdVar9);
    pdVar9 = ON_SimpleArray<double>::Array((ON_SimpleArray<double> *)local_68);
    ON_NurbsSurface::GetGrevilleAbcissae(nurbs_surface,1,pdVar9);
    (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
              (nurbs_surface,0);
    dVar17 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    d1.m_t[1] = dVar17;
    (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
              (nurbs_surface,1);
    _auStack_98 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    d1.m_t[0] = dVar17;
    iVar6 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
              [0x31])(nurbs_surface,0);
    bVar2 = -((byte)iVar6 & 1) & 1;
    if (bVar2 == 0) {
      iVar6 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                [0x30])(nurbs_surface,0);
      local_2aa = -((byte)iVar6 & 1);
    }
    else {
      local_2aa = 1;
    }
    iVar6 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
              [0x31])();
    bVar3 = -((byte)iVar6 & 1) & 1;
    if (bVar3 == 0) {
      iVar6 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                [0x30])();
      local_2ad = -((byte)iVar6 & 1);
    }
    else {
      local_2ad = 1;
    }
    if (bVar2 != 0) {
      iVar6 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                [0x2b])();
      v1 = v1 - (iVar6 + -1);
      while( true ) {
        iVar6 = ON_NurbsSurface::CVCount(nurbs_surface,0);
        bVar4 = false;
        if (v1 < iVar6) {
          pdVar9 = ON_SimpleArray<double>::operator[]((ON_SimpleArray<double> *)&gv.m_count,v0);
          dVar17 = *pdVar9;
          pdVar9 = ON_Interval::operator[]((ON_Interval *)(d1.m_t + 1),0);
          bVar4 = false;
          if (dVar17 < *pdVar9) {
            pdVar9 = ON_SimpleArray<double>::operator[]
                               ((ON_SimpleArray<double> *)&gv.m_count,v1 + -1);
            dVar17 = *pdVar9;
            pdVar9 = ON_Interval::operator[]((ON_Interval *)(d1.m_t + 1),1);
            bVar4 = dVar17 <= *pdVar9;
          }
        }
        if (!bVar4) break;
        v0 = v0 + 1;
        v1 = v1 + 1;
      }
      pdVar9 = ON_SimpleArray<double>::operator[]((ON_SimpleArray<double> *)&gv.m_count,v0);
      dVar17 = *pdVar9;
      pdVar9 = ON_SimpleArray<double>::operator[]((ON_SimpleArray<double> *)&gv.m_count,v1 + -1);
      ON_Interval::Set((ON_Interval *)(d1.m_t + 1),dVar17,*pdVar9);
    }
    if (bVar3 != 0) {
      iVar6 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                [0x2b])(nurbs_surface,1);
      gu.m_count = gu.m_count - (iVar6 + -1);
      while( true ) {
        iVar6 = ON_NurbsSurface::CVCount(nurbs_surface,1);
        bVar4 = false;
        if (gu.m_count < iVar6) {
          pdVar9 = ON_SimpleArray<double>::operator[]
                             ((ON_SimpleArray<double> *)local_68,gu.m_capacity);
          dVar17 = *pdVar9;
          pdVar9 = ON_Interval::operator[]((ON_Interval *)auStack_98,0);
          bVar4 = false;
          if (dVar17 < *pdVar9) {
            pdVar9 = ON_SimpleArray<double>::operator[]
                               ((ON_SimpleArray<double> *)local_68,gu.m_count + -1);
            dVar17 = *pdVar9;
            pdVar9 = ON_Interval::operator[]((ON_Interval *)auStack_98,1);
            bVar4 = dVar17 <= *pdVar9;
          }
        }
        if (!bVar4) break;
        gu.m_capacity = gu.m_capacity + 1;
        gu.m_count = gu.m_count + 1;
      }
      pdVar9 = ON_SimpleArray<double>::operator[]((ON_SimpleArray<double> *)local_68,gu.m_capacity);
      dVar17 = *pdVar9;
      pdVar9 = ON_SimpleArray<double>::operator[]
                         ((ON_SimpleArray<double> *)local_68,gu.m_count + -1);
      ON_Interval::Set((ON_Interval *)auStack_98,dVar17,*pdVar9);
    }
    local_370 = input_mesh;
    if (input_mesh == (ON_Mesh *)0x0) {
      local_370 = (ON_Mesh *)operator_new(0x6e0);
      ON_Mesh::ON_Mesh(local_370);
    }
    local_a8 = local_370;
    iVar6 = (v1 - v0) * (gu.m_count - gu.m_capacity);
    this = &ON_Mesh::DoublePrecisionVertices(local_370)->super_ON_SimpleArray<ON_3dPoint>;
    ON_SimpleArray<ON_3dPoint>::Reserve(this,(long)iVar6);
    ON_SimpleArray<ON_3fVector>::Reserve
              (&(local_370->m_N).super_ON_SimpleArray<ON_3fVector>,(long)iVar6);
    ON_SimpleArray<ON_2fPoint>::Reserve
              (&(local_370->m_T).super_ON_SimpleArray<ON_2fPoint>,(long)iVar6);
    ON_SimpleArray<ON_2dPoint>::Reserve
              (&(local_370->m_S).super_ON_SimpleArray<ON_2dPoint>,(long)iVar6);
    ON_SimpleArray<ON_MeshFace>::Reserve
              (&local_370->m_F,(long)((~v0 + v1) * (~gu.m_capacity + gu.m_count)));
    *(double *)&local_370->field_0x240 = d1.m_t[1];
    *(undefined8 *)&local_370->field_0x248 = in_XMM1_Qa;
    *(double *)&local_370->field_0x250 = _auStack_98;
    *(double *)&local_370->field_0x258 = d1.m_t[0];
    memset(&j,0,8);
    f._4_4_ = -1;
    for (local_128 = gu.m_capacity; (int)local_128 < gu.m_count; local_128 = local_128 + 1) {
      pdVar9 = ON_SimpleArray<double>::operator[]((ON_SimpleArray<double> *)local_68,local_128);
      S.x = *pdVar9;
      ON_Interval::NormalizedParameterAt((ON_Interval *)auStack_98,S.x);
      for (k = v0; k < v1; k = k + 1) {
        ON_NurbsSurface::GetCV(nurbs_surface,k,local_128,(ON_3dPoint *)&N.z);
        pdVar9 = ON_SimpleArray<double>::operator[]((ON_SimpleArray<double> *)&gv.m_count,k);
        dVar17 = *pdVar9;
        hint = (int  [2])ON_Interval::NormalizedParameterAt((ON_Interval *)(d1.m_t + 1),dVar17);
        pdVar9 = ON_SimpleArray<double>::operator[]((ON_SimpleArray<double> *)&gv.m_count,k);
        s = *pdVar9;
        pdVar9 = ON_SimpleArray<double>::operator[]((ON_SimpleArray<double> *)local_68,local_128);
        ON_Surface::EvNormal(&nurbs_surface->super_ON_Surface,s,*pdVar9,(ON_3dVector *)&S.y,0,&j);
        pOVar10 = ON_SimpleArray<ON_3dPoint>::AppendNew(this);
        pOVar10->z = V.y;
        pOVar10->x = N.z;
        pOVar10->y = V.x;
        pOVar11 = ON_SimpleArray<ON_3fVector>::AppendNew
                            (&(local_370->m_N).super_ON_SimpleArray<ON_3fVector>);
        ON_3fVector::operator=(pOVar11,(ON_3dVector *)&S.y);
        pOVar12 = ON_SimpleArray<ON_2dPoint>::AppendNew
                            (&(local_370->m_S).super_ON_SimpleArray<ON_2dPoint>);
        pOVar12->x = dVar17;
        pOVar12->y = S.x;
        this_00 = ON_SimpleArray<ON_2fPoint>::AppendNew
                            (&(local_370->m_T).super_ON_SimpleArray<ON_2fPoint>);
        ON_2fPoint::operator=(this_00,(ON_2dPoint *)hint);
        if ((v0 < k) && (gu.m_capacity < (int)local_128)) {
          local_138 = ON_SimpleArray<ON_MeshFace>::AppendNew(&local_370->m_F);
          local_138->vi[0] = f._4_4_;
          local_138->vi[1] = f._4_4_ + 1;
          f._4_4_ = f._4_4_ + 1;
          iVar6 = ON_SimpleArray<ON_3dPoint>::Count(this);
          local_138->vi[2] = iVar6 + -1;
          local_138->vi[3] = local_138->vi[2] + -1;
        }
      }
      f._4_4_ = f._4_4_ + 1;
    }
    ON_Mesh::UpdateSinglePrecisionVertices(local_370);
    uVar5 = v1 - v0;
    iVar6 = gu.m_count - gu.m_capacity;
    if ((local_2aa & 1) != 0) {
      k = 0;
      for (local_128 = 0; (int)local_128 < iVar6; local_128 = local_128 + 1) {
        iVar8 = (uVar5 - 1) + k;
        f._4_4_ = iVar8;
        ON_Mesh::Vertex(&local_150,local_370,k);
        ON_Mesh::SetVertex(local_370,iVar8,&local_150);
        if (bVar2 != 0) {
          pOVar11 = ON_SimpleArray<ON_3fVector>::operator[]
                              (&(local_370->m_N).super_ON_SimpleArray<ON_3fVector>,k);
          pOVar13 = ON_SimpleArray<ON_3fVector>::operator[]
                              (&(local_370->m_N).super_ON_SimpleArray<ON_3fVector>,f._4_4_);
          fVar1 = pOVar11->y;
          pOVar13->x = pOVar11->x;
          pOVar13->y = fVar1;
          pOVar13->z = pOVar11->z;
        }
        k = f._4_4_ + 1;
      }
    }
    if ((local_2ad & 1) != 0) {
      f._4_4_ = uVar5 * (iVar6 + -1);
      for (k = 0; iVar8 = f._4_4_, k < (int)uVar5; k = k + 1) {
        ON_Mesh::Vertex(&local_168,local_370,k);
        ON_Mesh::SetVertex(local_370,iVar8,&local_168);
        if (bVar3 != 0) {
          pOVar11 = ON_SimpleArray<ON_3fVector>::operator[]
                              (&(local_370->m_N).super_ON_SimpleArray<ON_3fVector>,k);
          pOVar13 = ON_SimpleArray<ON_3fVector>::operator[]
                              (&(local_370->m_N).super_ON_SimpleArray<ON_3fVector>,f._4_4_);
          fVar1 = pOVar11->y;
          pOVar13->x = pOVar11->x;
          pOVar13->y = fVar1;
          pOVar13->z = pOVar11->z;
        }
        f._4_4_ = f._4_4_ + 1;
      }
    }
    k = 0;
    for (f._4_4_ = 0; (int)f._4_4_ < 4; f._4_4_ = f._4_4_ + 1) {
      uVar7 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                [0x32])(nurbs_surface,(ulong)f._4_4_);
      if ((uVar7 & 1) != 0) {
        switch(f._4_4_) {
        case 0:
          k = 0;
          local_128 = 1;
          f._4_4_ = uVar5;
          break;
        case 1:
          k = uVar5 - 1;
          f._4_4_ = uVar5 * iVar6;
          local_128 = uVar5;
          break;
        case 2:
          k = uVar5 * (iVar6 + -1);
          local_128 = 1;
          f._4_4_ = uVar5 * iVar6;
          break;
        case 3:
          k = 0;
          f._4_4_ = uVar5 * (iVar6 + -1) + 1;
          local_128 = uVar5;
        }
        ON_Mesh::Vertex(&local_180,local_370,k);
        N.z = local_180.x;
        for (k = k + local_128; k < (int)f._4_4_; k = local_128 + k) {
          ON_Mesh::SetVertex(local_370,k,(ON_3dPoint *)&N.z);
        }
      }
    }
    if (bCleanMesh) {
      ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)&f_1,0x20);
      for (k = 0; iVar6 = k, iVar8 = ON_SimpleArray<ON_MeshFace>::Count(&local_370->m_F),
          iVar6 < iVar8; k = k + 1) {
        local_208 = ON_SimpleArray<ON_MeshFace>::operator[](&local_370->m_F,k);
        ON_Mesh::Vertex(&local_220,local_370,local_208->vi[0]);
        P[0].y = local_220.z;
        badfi._16_8_ = local_220.x;
        P[0].x = local_220.y;
        ON_Mesh::Vertex(&local_238,local_370,local_208->vi[1]);
        P[1].y = local_238.z;
        P[0].z = local_238.x;
        P[1].x = local_238.y;
        ON_Mesh::Vertex(&local_250,local_370,local_208->vi[2]);
        P[2].y = local_250.z;
        P[1].z = local_250.x;
        P[2].x = local_250.y;
        ON_Mesh::Vertex(&local_268,local_370,local_208->vi[3]);
        P[3].y = local_268.z;
        P[2].z = local_268.x;
        P[3].x = local_268.y;
        bVar4 = ON_3dPoint::operator==((ON_3dPoint *)&badfi.m_count,(ON_3dPoint *)&P[0].z);
        if (bVar4) {
          local_208->vi[1] = local_208->vi[2];
          local_208->vi[2] = local_208->vi[3];
          P[0].z = P[1].z;
          P[1].x = P[2].x;
          P[1].y = P[2].y;
          P[1].z = P[2].z;
          P[2].x = P[3].x;
          P[2].y = P[3].y;
        }
        bVar4 = ON_3dPoint::operator==((ON_3dPoint *)&P[0].z,(ON_3dPoint *)&P[1].z);
        if (bVar4) {
          local_208->vi[2] = local_208->vi[3];
          P[1].z = P[2].z;
          P[2].x = P[3].x;
          P[2].y = P[3].y;
        }
        bVar4 = ON_3dPoint::operator==((ON_3dPoint *)&P[1].z,(ON_3dPoint *)&P[2].z);
        if (bVar4) {
          local_208->vi[2] = local_208->vi[3];
          P[1].z = P[2].z;
          P[2].x = P[3].x;
          P[2].y = P[3].y;
        }
        bVar4 = ON_3dPoint::operator==((ON_3dPoint *)&P[2].z,(ON_3dPoint *)&badfi.m_count);
        if (bVar4) {
          local_208->vi[0] = local_208->vi[1];
          local_208->vi[1] = local_208->vi[2];
          local_208->vi[2] = local_208->vi[3];
          badfi._16_8_ = P[0].z;
          P[0].x = P[1].x;
          P[0].y = P[1].y;
          P[0].z = P[1].z;
          P[1].x = P[2].x;
          P[1].y = P[2].y;
          P[1].z = P[2].z;
          P[2].x = P[3].x;
          P[2].y = P[3].y;
        }
        if ((((local_208->vi[0] == local_208->vi[1]) || (local_208->vi[1] == local_208->vi[2])) ||
            (local_208->vi[3] == local_208->vi[0])) ||
           ((bVar4 = ON_3dPoint::operator==((ON_3dPoint *)&badfi.m_count,(ON_3dPoint *)&P[1].z),
            bVar4 || (bVar4 = ON_3dPoint::operator==((ON_3dPoint *)&P[0].z,(ON_3dPoint *)&P[2].z),
                     bVar4)))) {
          ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)&f_1,&k);
        }
      }
      iVar6 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)&f_1);
      if (0 < iVar6) {
        iVar6 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)&f_1);
        iVar8 = ON_SimpleArray<ON_MeshFace>::Count(&local_370->m_F);
        if (iVar6 == iVar8) {
          if (input_mesh == (ON_Mesh *)0x0) {
            if (local_370 != (ON_Mesh *)0x0) {
              (*(local_370->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
            }
          }
          else {
            ON_Mesh::Destroy(local_370);
          }
          local_a8 = (ON_Mesh *)0x0;
        }
        else {
          puVar14 = (uint *)ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)&f_1,0);
          k = *puVar14;
          f._4_4_ = 1;
          local_128 = k;
          while( true ) {
            local_128 = local_128 + 1;
            uVar7 = local_128;
            iVar6 = ON_SimpleArray<ON_MeshFace>::Count(&local_370->m_F);
            uVar5 = f._4_4_;
            if (iVar6 <= (int)uVar7) break;
            iVar6 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)&f_1);
            uVar7 = local_128;
            if (((int)uVar5 < iVar6) &&
               (puVar14 = (uint *)ON_SimpleArray<int>::operator[]
                                            ((ON_SimpleArray<int> *)&f_1,f._4_4_), uVar7 == *puVar14
               )) {
              f._4_4_ = f._4_4_ + 1;
            }
            else {
              pOVar15 = ON_SimpleArray<ON_MeshFace>::operator[](&local_370->m_F,local_128);
              iVar6 = k;
              k = k + 1;
              pOVar16 = ON_SimpleArray<ON_MeshFace>::operator[](&local_370->m_F,iVar6);
              *(undefined8 *)pOVar16->vi = *(undefined8 *)pOVar15->vi;
              *(undefined8 *)(pOVar16->vi + 2) = *(undefined8 *)(pOVar15->vi + 2);
            }
          }
          ON_SimpleArray<ON_MeshFace>::SetCount(&local_370->m_F,k);
        }
        if (local_a8 != (ON_Mesh *)0x0) {
          ON_Mesh::CullUnusedVertices(local_a8);
        }
      }
      ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)&f_1);
    }
    nurbs_surface_local = (ON_NurbsSurface *)local_a8;
    ON_SimpleArray<double>::~ON_SimpleArray((ON_SimpleArray<double> *)local_68);
    ON_SimpleArray<double>::~ON_SimpleArray((ON_SimpleArray<double> *)&gv.m_count);
  }
  return (ON_Mesh *)nurbs_surface_local;
}

Assistant:

ON_Mesh* ON_ControlPolygonMesh(
  const ON_NurbsSurface& nurbs_surface,
  bool bCleanMesh,
  ON_Mesh* input_mesh
)
{
  int u0 = 0;
  int u1 = nurbs_surface.CVCount(0);

  int v0 = 0;
  int v1 = nurbs_surface.CVCount(1);

  if ( 0 == nurbs_surface.m_cv || !nurbs_surface.IsValid() )
  {
    ON_ERROR("ON_ControlPolygonMesh - surface is not valid");
    return nullptr;
  }

  ON_SimpleArray<double> gu(u1);
  ON_SimpleArray<double> gv(v1);
  gu.SetCount(u1);
  gv.SetCount(v1);
  nurbs_surface.GetGrevilleAbcissae(0,gu.Array());
  nurbs_surface.GetGrevilleAbcissae(1,gv.Array());

  ON_Interval d0 = nurbs_surface.Domain(0);
  ON_Interval d1 = nurbs_surface.Domain(1);

  bool bPeriodic0 = nurbs_surface.IsPeriodic(0)?true:false;
  bool bIsClosed0 = bPeriodic0 ? true : (nurbs_surface.IsClosed(0)?true:false);
  bool bPeriodic1 = nurbs_surface.IsPeriodic(1)?true:false;
  bool bIsClosed1 = bPeriodic1 ? true : (nurbs_surface.IsClosed(1)?true:false);

  if ( bPeriodic0 )
  {
    u1 -= (nurbs_surface.Degree(0) - 1);
    while ( u1 < nurbs_surface.CVCount(0) && gu[u0] < d0[0] && gu[u1-1] <= d0[1] )
    {
      u0++;
      u1++;
    }
    d0.Set(gu[u0],gu[u1-1]);
  }

  if ( bPeriodic1 )
  {
    v1 -= (nurbs_surface.Degree(1) - 1);
    while ( v1 < nurbs_surface.CVCount(1) && gv[v0] < d1[0] && gv[v1-1] <= d1[1] )
    {
      v0++;
      v1++;
    }
    d1.Set(gv[v0],gv[v1-1]);
  }


  ON_Mesh* mesh = (0 == input_mesh) ? new ON_Mesh() : input_mesh;

  int vertex_count = (u1-u0)*(v1-v0);
  int face_count = (u1-u0-1)*(v1-v0-1);

  ON_3dPointArray& dpv = mesh->DoublePrecisionVertices();
  dpv.Reserve(vertex_count);
  mesh->m_N.Reserve(vertex_count);
  mesh->m_T.Reserve(vertex_count);
  mesh->m_S.Reserve(vertex_count);
  mesh->m_F.Reserve(face_count);
  mesh->m_srf_domain[0] = d0;
  mesh->m_srf_domain[1] = d1;

  ON_3dPoint V;
  ON_3dVector N;
  ON_2dPoint S;
  ON_2dPoint T;

  int hint[2] = {0,0};
  int i, j;
  int k = -1;
  for ( j = v0; j < v1; j++)
  {
    S.y = gv[j];
    T.y = d1.NormalizedParameterAt(S.y);
    for ( i = u0; i < u1; i++)
    {
      nurbs_surface.GetCV( i, j, V);
      S.x = gu[i];
      T.x = d0.NormalizedParameterAt(S.x);
      nurbs_surface.EvNormal(gu[i],gv[j],N,0,hint);
      dpv.AppendNew() = V;
      mesh->m_N.AppendNew() = N;
      mesh->m_S.AppendNew() = S;
      mesh->m_T.AppendNew() = T;
      if ( i > u0 && j > v0 )
      {
        ON_MeshFace& f = mesh->m_F.AppendNew();
        f.vi[0] = k++;
        f.vi[1] = k;
        f.vi[2] = dpv.Count()-1;
        f.vi[3] = f.vi[2]-1;
      }
    }
    k++;
  }
  
  mesh->UpdateSinglePrecisionVertices();

  u1 -= u0;
  v1 -= v0;

  // make sure closed seams are spot on
  if ( bIsClosed0 )
  {
    i = 0;
    for ( j = 0; j < v1; j++ )
    {
      k = i + (u1-1);
      mesh->SetVertex(k, mesh->Vertex(i));
      if ( bPeriodic0 )
      {
        mesh->m_N[k] = mesh->m_N[i];
      }
      i = k+1;
      // do NOT synch texture coordinates
    }
  }

  if ( bIsClosed1 )
  {
    for ( i = 0, k = u1*(v1-1); i < u1; i++, k++ )
    {
      mesh->SetVertex(k, mesh->Vertex(i));
      if ( bPeriodic1 )
      {
        mesh->m_N[k] = mesh->m_N[i];
      }
      // do NOT synch texture coordinates
    }
  }

  // make sure singular ends are spot on
  i=0;
  for ( k = 0; k < 4; k++ )
  {
    if ( nurbs_surface.IsSingular(k) )
    {
      switch(k)
      {
      case 0: // 0 = south
        i = 0;
        j = 1;
        k = u1;
        break;

      case 1: // 1 = east
        i = u1-1;
        j = u1;
        k = u1*v1;
        break;

      case 2: // 2 = north
        i = u1*(v1-1);
        j = 1;
        k = u1*v1;
        break;

      case 3: // 3 = west
        i = 0;
        j = u1;
        k = u1*(v1-1)+1;
        break;
      }
      V = mesh->Vertex(i);
      for ( i = i+j; i < k; i += j )
      {
        mesh->SetVertex(i, V);
      }
    }
  }

  if ( bCleanMesh )
  {
    // Clean up triangles etc.
    ON_3dPoint P[4];
    ON_SimpleArray<int> badfi(32);
    for ( i = 0; i < mesh->m_F.Count(); i++ )
    {
      ON_MeshFace& f = mesh->m_F[i];
      P[0] = mesh->Vertex(f.vi[0]);
      P[1] = mesh->Vertex(f.vi[1]);
      P[2] = mesh->Vertex(f.vi[2]);
      P[3] = mesh->Vertex(f.vi[3]);
      if ( P[0] == P[1] )
      {
        f.vi[1] = f.vi[2];
        f.vi[2] = f.vi[3];
        P[1] = P[2];
        P[2] = P[3];
      }
      if ( P[1] == P[2] )
      {
        f.vi[2] = f.vi[3];
        P[2] = P[3];
      }
      if ( P[2] == P[3] )
      {
        f.vi[2] = f.vi[3];
        P[2] = P[3];
      }
      if ( P[3] == P[0] )
      {
        f.vi[0] = f.vi[1];
        f.vi[1] = f.vi[2];
        f.vi[2] = f.vi[3];
        P[0] = P[1];
        P[1] = P[2];
        P[2] = P[3];
      }
      if (    f.vi[0] == f.vi[1] 
           || f.vi[1] == f.vi[2] 
           || f.vi[3] == f.vi[0] 
           || P[0] == P[2] || P[1] == P[3] )
      {
        badfi.Append(i);
      }
    }
    
    if ( badfi.Count() > 0 )
    {
      if ( badfi.Count() == mesh->m_F.Count() )
      {
        if ( input_mesh )
        {
          mesh->Destroy();
        }
        else
        {
          delete mesh;
        }
        mesh = 0;
      }
      else
      {
        // remove bad faces
        i = badfi[0];
        j = i+1;
        k = 1;
        for ( j = i+1; j < mesh->m_F.Count(); j++ )
        {
          if ( k < badfi.Count() && j == badfi[k] )
          {
            k++;
          }
          else
          {
            mesh->m_F[i++] = mesh->m_F[j];
          }
        }
        mesh->m_F.SetCount(i);
      }

      // 29 May 2008: Mikko, TRR 34687:
      // Added crash protection. At this point mesh is nullptr if it contained all bad faces.
      if ( mesh)
        mesh->CullUnusedVertices();
    }
  }

  return mesh;
}